

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O0

void LiteScript::StateExecutor::I_OP_ADD_ASSIGN(State *state,Instruction *instr)

{
  size_type sVar1;
  reference pvVar2;
  undefined1 local_58 [8];
  Variable result;
  Variable v1;
  undefined1 local_28 [8];
  Variable v2;
  Instruction *instr_local;
  State *state_local;
  
  state->line_num = state->line_num + 1;
  v2.nb_ref = (uint *)instr;
  sVar1 = std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::size
                    (&state->op_lifo);
  if (1 < sVar1) {
    pvVar2 = std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::back
                       (&state->op_lifo);
    Variable::Variable((Variable *)local_28,pvVar2);
    PopValue(state);
    pvVar2 = std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::back
                       (&state->op_lifo);
    Variable::Variable((Variable *)&result.nb_ref,pvVar2);
    PopValue(state);
    Variable::operator+=((Variable *)local_58,(Variable *)&result.nb_ref);
    std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::push_back
              (&state->op_lifo,(value_type *)local_58);
    Variable::~Variable((Variable *)local_58);
    Variable::~Variable((Variable *)&result.nb_ref);
    Variable::~Variable((Variable *)local_28);
  }
  return;
}

Assistant:

void LiteScript::StateExecutor::I_OP_ADD_ASSIGN(State& state, Instruction& instr) {
    state.line_num++;
    if (state.op_lifo.size() < 2)
        return;
    Variable v2(state.op_lifo.back());
    PopValue(state);
    Variable v1(state.op_lifo.back());
    PopValue(state);
    Variable result = (v1 += v2);
    state.op_lifo.push_back(result);}